

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m3x3.cpp
# Opt level: O0

double MakeAngleContinuous(double angle,double lastangle)

{
  double lastangle_local;
  double angle_local;
  
  for (angle_local = angle; lastangle + 180.0 < angle_local; angle_local = angle_local - 360.0) {
  }
  for (; angle_local < lastangle - 180.0; angle_local = angle_local + 360.0) {
  }
  return angle_local;
}

Assistant:

double MakeAngleContinuous(double angle, double lastangle)
{
    while (angle > lastangle + 180.0)
        angle -= 360.0;

    while (angle < lastangle - 180.0)
        angle += 360.0;

    return angle;
}